

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

lword writesection(GlobalVars *gv,uint8_t *dest,Reloc *r,lword v)

{
  char cVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  long v_00;
  RelocInsert *pRVar6;
  uint n;
  bool bVar7;
  uint be;
  RelocInsert *pRVar8;
  ulong uVar9;
  lword v_01;
  bool local_40;
  
  cVar1 = gv->endianess;
  uVar9 = (ulong)r->rtype;
  if (uVar9 < 0x23) {
    if ((0x700000734U >> (uVar9 & 0x3f) & 1) != 0) {
      bVar3 = 1;
      local_40 = 1;
      goto LAB_0010f491;
    }
    if (uVar9 == 0) {
      return 0;
    }
  }
  local_40 = 0;
  bVar3 = 0;
LAB_0010f491:
  pRVar8 = (RelocInsert *)&r->insert;
  pRVar6 = pRVar8;
  while( true ) {
    pRVar6 = pRVar6->next;
    be = (uint)(cVar1 != '\0');
    if (pRVar6 == (RelocInsert *)0x0) break;
    writereloc(be,dest,(uint)pRVar6->bpos,(uint)pRVar6->bsiz,0);
  }
  while( true ) {
    pRVar8 = pRVar8->next;
    if (pRVar8 == (RelocInsert *)0x0) {
      return 0;
    }
    uVar9 = pRVar8->mask;
    uVar2 = pRVar8->bpos;
    n = (uint)pRVar8->bsiz;
    iVar4 = lshiftcnt(uVar9);
    v_01 = (long)(uVar9 & v) >> ((byte)iVar4 & 0x3f);
    bVar7 = (bool)(-1 < (long)uVar9 & bVar3);
    if (bVar7) {
      v_01 = sign_extend(v_01,n);
    }
    bVar5 = checkrange(v_01,local_40,n);
    if (bVar5 == 0) break;
    v_00 = readreloc(be,dest,(uint)uVar2,n);
    if (bVar7) {
      v_00 = sign_extend(v_00,n);
    }
    writereloc(be,dest,(uint)uVar2,n,v_00 + v_01);
  }
  return v_01;
}

Assistant:

lword writesection(struct GlobalVars *gv,uint8_t *dest,struct Reloc *r,lword v)
/* Write 'v' into the bit-field defined by the relocation type in 'r'.
   Do range checks first, depending on the reloc type.
   Returns 0 on success or the masked and normalized value which failed
   on the range check. */
{
  bool be = gv->endianess != _LITTLE_ENDIAN_;
  uint8_t t = r->rtype;
  bool signedval = t==R_PC||t==R_GOTPC||t==R_GOTOFF||t==R_PLTPC||t==R_PLTOFF||
                   t==R_SD||t==R_SD2||t==R_SD21||t==R_MOSDREL;
  struct RelocInsert *ri;

  if (t == R_NONE)
    return 0;

  /* Reset all relocation fields to zero. */
  for (ri=r->insert; ri!=NULL; ri=ri->next)
    writereloc(be,dest,ri->bpos,ri->bsiz,0);

  /* add value to relocation fields */
  for (ri=r->insert; ri!=NULL; ri=ri->next) {
    lword mask = ri->mask;
    lword insval = v & mask;
    lword oldval;
    int bpos = ri->bpos;
    int bsiz = ri->bsiz;

    insval >>= lshiftcnt(mask);  /* normalize according mask */
    if (mask>=0 && signedval)
      insval = sign_extend(insval,bsiz);

    if (!checkrange(insval,signedval,bsiz))
      return insval;  /* range check failed on 'insval' */

    /* add to value already present in this field */
    oldval = readreloc(be,dest,bpos,bsiz);
    if (mask>=0 && signedval)
      oldval = sign_extend(oldval,bsiz);
    writereloc(be,dest,bpos,bsiz,oldval+insval);
  }

  return 0;
}